

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O3

ssize_t __thiscall
jaegertracing::agent::thrift::Agent_emitZipkinBatch_args::read
          (Agent_emitZipkinBatch_args *this,int __fd,void *__buf,size_t __nbytes)

{
  vector<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_> *this_00;
  pointer pSVar1;
  pointer pSVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  TProtocol *this_01;
  long lVar7;
  pointer pSVar8;
  uint32_t _size0;
  int16_t fid;
  TType ftype;
  TType _etype3;
  string fname;
  uint local_6c;
  short local_66;
  int local_64;
  Agent_emitZipkinBatch_args *local_60;
  undefined1 local_54 [4];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_01 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_01);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar3 = (*this_01->_vptr_TProtocol[0x19])(this_01,&local_50);
  this_00 = &this->spans;
  local_60 = this;
  do {
    iVar4 = (*this_01->_vptr_TProtocol[0x1b])(this_01,&local_50,&local_64,&local_66);
    iVar4 = iVar4 + iVar3;
    if (local_64 == 0) {
      iVar3 = (*this_01->_vptr_TProtocol[0x1a])(this_01);
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      this_01->input_recursion_depth_ = this_01->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar3 + iVar4);
    }
    if (local_66 == 1) {
      if (local_64 != 0xf) {
        iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
        goto LAB_001f7fc0;
      }
      pSVar1 = (this->spans).
               super__Vector_base<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pSVar2 = (this->spans).
               super__Vector_base<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pSVar8 = pSVar1;
      if (pSVar2 != pSVar1) {
        do {
          (*(code *)**(undefined8 **)pSVar8)(pSVar8);
          pSVar8 = pSVar8 + 1;
        } while (pSVar8 != pSVar2);
        (local_60->spans).
        super__Vector_base<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar1;
      }
      iVar3 = (*this_01->_vptr_TProtocol[0x1f])(this_01,local_54,&local_6c);
      std::vector<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>::
      resize(this_00,(ulong)local_6c);
      this = local_60;
      iVar3 = iVar3 + iVar4;
      if (local_6c != 0) {
        lVar7 = 0;
        uVar6 = 0;
        do {
          pSVar1 = (this_00->
                   super__Vector_base<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          iVar4 = (**(code **)(*(long *)(&pSVar1->field_0x0 + lVar7) + 0x10))
                            (&pSVar1->field_0x0 + lVar7,this_01);
          iVar3 = iVar3 + iVar4;
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + 0x98;
        } while (uVar6 < local_6c);
      }
      iVar5 = (*this_01->_vptr_TProtocol[0x20])(this_01);
      iVar5 = iVar5 + iVar3;
      this->__isset = (_Agent_emitZipkinBatch_args__isset)((byte)this->__isset | 1);
    }
    else {
      iVar5 = (*this_01->_vptr_TProtocol[0x2c])(this_01);
LAB_001f7fc0:
      iVar5 = iVar5 + iVar4;
    }
    iVar3 = (*this_01->_vptr_TProtocol[0x1c])(this_01);
    iVar3 = iVar3 + iVar5;
  } while( true );
}

Assistant:

uint32_t Agent_emitZipkinBatch_args::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_LIST) {
          {
            this->spans.clear();
            uint32_t _size0;
            ::apache::thrift::protocol::TType _etype3;
            xfer += iprot->readListBegin(_etype3, _size0);
            this->spans.resize(_size0);
            uint32_t _i4;
            for (_i4 = 0; _i4 < _size0; ++_i4)
            {
              xfer += this->spans[_i4].read(iprot);
            }
            xfer += iprot->readListEnd();
          }
          this->__isset.spans = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}